

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace.c
# Opt level: O0

void workspace_destroy(workspace *workspace)

{
  client *client_00;
  client *client;
  node *node;
  workspace *workspace_local;
  
  if (workspace->clients != (list *)0x0) {
    for (client = (client *)workspace->clients->head; client != (client *)0x0;
        client = *(client **)client) {
      client_00 = get_client_from_client_node((node *)client);
      client_destroy(client_00);
    }
    list_destroy(workspace->clients);
  }
  free(workspace);
  return;
}

Assistant:

void workspace_destroy(struct workspace *workspace)
{
        if (workspace->clients != NULL) {
                LIST_FOR_EACH(workspace->clients, node)
                {
                        struct client *client = get_client_from_client_node(node);

                        client_destroy(client);
                }

                list_destroy(workspace->clients);
        }

        free(workspace);
}